

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O2

int __thiscall mxx::comm::copy(comm *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  comm(this);
  MPI_Comm_dup(*(undefined8 *)(dst + 8),&this->mpi_comm);
  init_ranksize(this);
  this->do_free = true;
  return (int)this;
}

Assistant:

comm copy() const {
        comm o;
        MPI_Comm_dup(mpi_comm, &o.mpi_comm);
        o.init_ranksize();
        o.do_free = true;
        return o;
    }